

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O0

void __thiscall
sptk::KaiserWindow::KaiserWindow(KaiserWindow *this,int window_length,double beta,bool periodic)

{
  _func_int **pp_Var1;
  int iVar2;
  reference pvVar3;
  byte in_DL;
  undefined4 in_ESI;
  WindowInterface *in_RDI;
  _func_int **in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double x;
  int i;
  double *window;
  double z;
  double a;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_4c;
  
  WindowInterface::WindowInterface(in_RDI);
  in_RDI->_vptr_WindowInterface = (_func_int **)&PTR__KaiserWindow_00147bd0;
  *(undefined4 *)&in_RDI[1]._vptr_WindowInterface = in_ESI;
  in_RDI[2]._vptr_WindowInterface = in_XMM0_Qa;
  *(byte *)&in_RDI[3]._vptr_WindowInterface = in_DL & 1;
  *(undefined1 *)((long)&in_RDI[3]._vptr_WindowInterface + 1) = 1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13027f);
  if ((*(int *)&in_RDI[1]._vptr_WindowInterface < 1) ||
     ((double)in_RDI[2]._vptr_WindowInterface <= 0.0 &&
      (double)in_RDI[2]._vptr_WindowInterface != 0.0)) {
    *(undefined1 *)((long)&in_RDI[3]._vptr_WindowInterface + 1) = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    if (*(int *)&in_RDI[1]._vptr_WindowInterface == 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),0);
      *pvVar3 = 1.0;
    }
    else {
      if (((ulong)in_RDI[3]._vptr_WindowInterface & 1) == 0) {
        iVar2 = *(int *)&in_RDI[1]._vptr_WindowInterface + -1;
      }
      else {
        iVar2 = *(int *)&in_RDI[1]._vptr_WindowInterface;
      }
      dVar4 = anon_unknown.dwarf_50999::I0((double)in_RDI[2]._vptr_WindowInterface,500,1e-06);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),0);
      for (local_4c = 0; local_4c < *(int *)&in_RDI[1]._vptr_WindowInterface;
          local_4c = local_4c + 1) {
        dVar5 = ((double)local_4c - (double)iVar2 * 0.5) / ((double)iVar2 * 0.5);
        pp_Var1 = in_RDI[2]._vptr_WindowInterface;
        dVar5 = sqrt(1.0 - dVar5 * dVar5);
        dVar5 = anon_unknown.dwarf_50999::I0((double)pp_Var1 * dVar5,500,1e-06);
        pvVar3[local_4c] = (1.0 / dVar4) * dVar5;
      }
    }
  }
  return;
}

Assistant:

KaiserWindow::KaiserWindow(int window_length, double beta, bool periodic)
    : window_length_(window_length),
      beta_(beta),
      periodic_(periodic),
      is_valid_(true) {
  if (window_length_ <= 0 || beta_ < 0.0) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const double a(0.5 * (periodic_ ? window_length_ : window_length_ - 1));
  const double z(1.0 / I0(beta_));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    const double x((i - a) / a);
    window[i] = z * I0(beta_ * std::sqrt(1.0 - x * x));
  }
}